

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O0

aiNode * __thiscall Assimp::BVHLoader::ReadEndSite(BVHLoader *this,string *pParentName)

{
  bool bVar1;
  aiNode *paVar2;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar3;
  basic_formatter *pbVar4;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  string local_270;
  string local_250;
  undefined1 local_230 [8];
  string token;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  aiNode *local_1e8;
  aiNode *node;
  string local_68;
  undefined1 local_38 [8];
  string openBrace;
  string *pParentName_local;
  BVHLoader *this_local;
  
  openBrace.field_2._8_8_ = pParentName;
  GetNextToken_abi_cxx11_((string *)local_38,this);
  bVar1 = std::operator!=((string *)local_38,"{");
  if (bVar1) {
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&node);
    pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&node,
                        (char (*) [40])"Expected opening brace \"{\", but found \"");
    pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_38);
    pbVar4 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar3,(char (*) [3])0xb64072);
    Formatter::basic_formatter::operator_cast_to_string(&local_68,pbVar4);
    ThrowException(this,&local_68);
  }
  paVar2 = (aiNode *)operator_new(0x478);
  token.field_2._M_local_buf[0xf] = '\x01';
  std::operator+(&local_208,"EndSite_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 openBrace.field_2._8_8_);
  aiNode::aiNode(paVar2,&local_208);
  token.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::~string((string *)&local_208);
  local_1e8 = paVar2;
  std::__cxx11::string::string((string *)local_230);
  while( true ) {
    std::__cxx11::string::clear();
    GetNextToken_abi_cxx11_(&local_250,this);
    std::__cxx11::string::operator=((string *)local_230,(string *)&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_230,"OFFSET");
    if (!bVar1) break;
    ReadNodeOffset(this,local_1e8);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_230,"}");
  paVar2 = local_1e8;
  if (!bVar1) {
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
              (&local_3e8);
    pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_3e8,(char (*) [18])"Unknown keyword \"");
    pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_230);
    pbVar4 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar3,(char (*) [3])0xb64072);
    Formatter::basic_formatter::operator_cast_to_string(&local_270,pbVar4);
    ThrowException(this,&local_270);
  }
  std::__cxx11::string::~string((string *)local_230);
  std::__cxx11::string::~string((string *)local_38);
  return paVar2;
}

Assistant:

aiNode* BVHLoader::ReadEndSite( const std::string& pParentName)
{
    // check opening brace
    std::string openBrace = GetNextToken();
    if( openBrace != "{")
        ThrowException( format() << "Expected opening brace \"{\", but found \"" << openBrace << "\".");

    // Create a node
    aiNode* node = new aiNode( "EndSite_" + pParentName);

    // now read the node's contents. Only possible entry is "OFFSET"
    std::string token;
    while( 1) {
        token.clear();
        token = GetNextToken();

        // end node's offset
        if( token == "OFFSET") {
            ReadNodeOffset( node);
        } else if( token == "}") {
            // we're done with the end node
            break;
        } else {
            // everything else is a parse error
            ThrowException( format() << "Unknown keyword \"" << token << "\"." );
        }
    }

    // and return the sub-hierarchy we built here
    return node;
}